

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

string * toString_abi_cxx11_(string *__return_storage_ptr__,XMLError error)

{
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  XMLError local_14;
  string *psStack_10;
  XMLError error_local;
  
  local_14 = error;
  psStack_10 = __return_storage_ptr__;
  switch(error) {
  case XML_SUCCESS:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_SUCCESS",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case XML_NO_ATTRIBUTE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_NO_ATTRIBUTE",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case XML_WRONG_ATTRIBUTE_TYPE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_WRONG_ATTRIBUTE_TYPE",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case XML_ERROR_FILE_NOT_FOUND:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_FILE_NOT_FOUND",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case XML_ERROR_FILE_COULD_NOT_BE_OPENED:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_FILE_COULD_NOT_BE_OPENED",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case XML_ERROR_FILE_READ_ERROR:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_FILE_READ_ERROR",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case XML_ERROR_PARSING_ELEMENT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_PARSING_ELEMENT",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case XML_ERROR_PARSING_ATTRIBUTE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_PARSING_ATTRIBUTE",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case XML_ERROR_PARSING_TEXT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_PARSING_TEXT",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case XML_ERROR_PARSING_CDATA:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_PARSING_CDATA",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
    break;
  case XML_ERROR_PARSING_COMMENT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_PARSING_COMMENT",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case XML_ERROR_PARSING_DECLARATION:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_PARSING_DECLARATION",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case XML_ERROR_PARSING_UNKNOWN:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_PARSING_UNKNOWN",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case XML_ERROR_EMPTY_DOCUMENT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_EMPTY_DOCUMENT",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case XML_ERROR_MISMATCHED_ELEMENT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_MISMATCHED_ELEMENT",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case XML_ERROR_PARSING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_ERROR_PARSING",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  case XML_CAN_NOT_CONVERT_TEXT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_CAN_NOT_CONVERT_TEXT",&local_34);
    std::allocator<char>::~allocator(&local_34);
    break;
  case XML_NO_TEXT_NODE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"XML_NO_TEXT_NODE",&local_35);
    std::allocator<char>::~allocator(&local_35);
    break;
  default:
    std::__cxx11::to_string(&local_78,error);
    std::operator+(&local_58,"unknown error code <",&local_78);
    std::operator+(__return_storage_ptr__,&local_58,">");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString( tinyxml2::XMLError error )
{
  switch ( error )
  {
    case tinyxml2::XML_SUCCESS: return "XML_SUCCESS";
    case tinyxml2::XML_NO_ATTRIBUTE: return "XML_NO_ATTRIBUTE";
    case tinyxml2::XML_WRONG_ATTRIBUTE_TYPE: return "XML_WRONG_ATTRIBUTE_TYPE";
    case tinyxml2::XML_ERROR_FILE_NOT_FOUND: return "XML_ERROR_FILE_NOT_FOUND";
    case tinyxml2::XML_ERROR_FILE_COULD_NOT_BE_OPENED: return "XML_ERROR_FILE_COULD_NOT_BE_OPENED";
    case tinyxml2::XML_ERROR_FILE_READ_ERROR: return "XML_ERROR_FILE_READ_ERROR";
    case tinyxml2::XML_ERROR_PARSING_ELEMENT: return "XML_ERROR_PARSING_ELEMENT";
    case tinyxml2::XML_ERROR_PARSING_ATTRIBUTE: return "XML_ERROR_PARSING_ATTRIBUTE";
    case tinyxml2::XML_ERROR_PARSING_TEXT: return "XML_ERROR_PARSING_TEXT";
    case tinyxml2::XML_ERROR_PARSING_CDATA: return "XML_ERROR_PARSING_CDATA";
    case tinyxml2::XML_ERROR_PARSING_COMMENT: return "XML_ERROR_PARSING_COMMENT";
    case tinyxml2::XML_ERROR_PARSING_DECLARATION: return "XML_ERROR_PARSING_DECLARATION";
    case tinyxml2::XML_ERROR_PARSING_UNKNOWN: return "XML_ERROR_PARSING_UNKNOWN";
    case tinyxml2::XML_ERROR_EMPTY_DOCUMENT: return "XML_ERROR_EMPTY_DOCUMENT";
    case tinyxml2::XML_ERROR_MISMATCHED_ELEMENT: return "XML_ERROR_MISMATCHED_ELEMENT";
    case tinyxml2::XML_ERROR_PARSING: return "XML_ERROR_PARSING";
    case tinyxml2::XML_CAN_NOT_CONVERT_TEXT: return "XML_CAN_NOT_CONVERT_TEXT";
    case tinyxml2::XML_NO_TEXT_NODE: return "XML_NO_TEXT_NODE";
    default: return "unknown error code <" + std::to_string( error ) + ">";
  }
}